

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O2

void __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addType
          (SearchableObjectHolder<helics::Broker,_helics::CoreType> *this,string *name,CoreType type
          )

{
  mapped_type *this_00;
  value_type local_14;
  
  std::mutex::lock((mutex *)this);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
                          *)(this + 0x58),name);
  std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>::push_back(this_00,&local_14);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void addType(const std::string& name, Y type)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        typeMap[name].push_back(type);
    }